

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall
CGraphics_Threaded::QuadsText(CGraphics_Threaded *this,float x,float y,float Size,char *pText)

{
  char cVar1;
  long lVar2;
  long in_FS_OFFSET;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_5c;
  CQuadItem QuadItem;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  fVar3 = x;
  local_5c = y;
  while( true ) {
    cVar1 = *pText;
    if (cVar1 == '\0') break;
    if (cVar1 == '\n') {
      local_5c = local_5c + Size;
      fVar3 = x;
      pText = pText + 1;
    }
    else {
      fVar4 = (float)(int)(cVar1 % '\x10') * 0.0625;
      fVar5 = (float)(int)(cVar1 / '\x10') * 0.0625;
      (**(code **)(*(long *)this + 0xd0))(fVar4,fVar5,fVar4 + 0.0625,fVar5 + 0.0625,this,0xffffffff)
      ;
      QuadItem.m_Y = local_5c;
      QuadItem.m_X = fVar3;
      QuadItem.m_Width = Size;
      QuadItem.m_Height = Size;
      (**(code **)(*(long *)this + 0xe8))(this,&QuadItem,1);
      fVar3 = fVar3 + Size * 0.5;
      pText = pText + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGraphics_Threaded::QuadsText(float x, float y, float Size, const char *pText)
{
	float StartX = x;

	while(*pText)
	{
		char c = *pText;
		pText++;

		if(c == '\n')
		{
			x = StartX;
			y += Size;
		}
		else
		{
			QuadsSetSubset(
				(c%16)/16.0f,
				(c/16)/16.0f,
				(c%16)/16.0f+1.0f/16.0f,
				(c/16)/16.0f+1.0f/16.0f);

			CQuadItem QuadItem(x, y, Size, Size);
			QuadsDrawTL(&QuadItem, 1);
			x += Size/2;
		}
	}
}